

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<kj::HttpHeaders::Header>::resize
          (ArrayBuilder<kj::HttpHeaders::Header> *this,size_t size)

{
  Header *pHVar1;
  Header *pHVar2;
  
  pHVar2 = this->ptr + size;
  if (this->pos < pHVar2) {
    pHVar1 = this->pos;
    while (pHVar1 < pHVar2) {
      this->pos = pHVar1 + 1;
      (pHVar1->name).content.ptr = (char *)0x0;
      (pHVar1->name).content.size_ = 0;
      (pHVar1->value).content.ptr = (char *)0x0;
      (pHVar1->value).content.size_ = 0;
      (pHVar1->name).content.ptr = "";
      (pHVar1->name).content.size_ = 1;
      (pHVar1->value).content.ptr = "";
      (pHVar1->value).content.size_ = 1;
      pHVar1 = this->pos;
    }
    return;
  }
  this->pos = pHVar2;
  return;
}

Assistant:

void resize(size_t size) {
    KJ_IREQUIRE(size <= capacity(), "can't resize past capacity");

    T* target = ptr + size;
    if (target > pos) {
      // expand
      if (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
        // const_cast is safe here because the member won't ever be dereferenced because it
        // points to the end of the segment.
        pos = const_cast<RemoveConst<T>*>(target);
      } else {
        while (pos < target) {
          kj::ctor(*pos++);
        }
      }
    } else {
      // truncate
      if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
        // const_cast is safe here because the member won't ever be dereferenced because it
        // points to the end of the segment.
        pos = const_cast<RemoveConst<T>*>(target);
      } else {
        while (pos > target) {
          kj::dtor(*--pos);
        }
      }
    }
  }